

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::GetOrAddPropertyId
          (ThreadContext *this,CharacterBuffer<char16_t> *propertyName,PropertyRecord **propRecord)

{
  PropertyRecord *pPVar1;
  CharacterBuffer<char16_t> local_30;
  PropertyRecord **local_20;
  PropertyRecord **propRecord_local;
  CharacterBuffer<char16_t> *propertyName_local;
  ThreadContext *this_local;
  
  local_20 = propRecord;
  propRecord_local = (PropertyRecord **)propertyName;
  propertyName_local = (CharacterBuffer<char16_t> *)this;
  EnterPinnedScope(propRecord);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
            (&local_30,(CharacterBuffer<char16_t> *)propRecord_local);
  pPVar1 = GetOrAddPropertyRecord(this,&local_30);
  *local_20 = pPVar1;
  LeavePinnedScope();
  return;
}

Assistant:

void ThreadContext::GetOrAddPropertyId(_In_ JsUtil::CharacterBuffer<WCHAR> const& propertyName, _Out_ Js::PropertyRecord const ** propRecord)
{
    EnterPinnedScope((volatile void **)propRecord);
    *propRecord = GetOrAddPropertyRecord(propertyName);
    LeavePinnedScope();
}